

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_bftst_32_aw(void)

{
  uint uVar1;
  uint uVar2;
  sbyte sVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) != 0) {
    my_fc_handler(m68ki_cpu.s_flag | 2);
    uVar4 = m68ki_cpu.pc & m68ki_cpu.address_mask;
    m68ki_cpu.pc = m68ki_cpu.pc + 2;
    my_fc_handler(m68ki_cpu.s_flag | 2);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar4 = pmmu_translate_addr(uVar4);
    }
    uVar4 = m68k_read_memory_16(uVar4 & m68ki_cpu.address_mask);
    my_fc_handler(m68ki_cpu.s_flag | 2);
    uVar7 = m68ki_cpu.pc & m68ki_cpu.address_mask;
    m68ki_cpu.pc = m68ki_cpu.pc + 2;
    my_fc_handler(m68ki_cpu.s_flag | 2);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar7 = pmmu_translate_addr(uVar7);
    }
    uVar1 = m68k_read_memory_16(uVar7 & m68ki_cpu.address_mask);
    if ((uVar4 >> 0xb & 1) == 0) {
      uVar7 = uVar4 >> 6 & 0x1f;
    }
    else {
      uVar7 = m68ki_cpu.dar[uVar4 >> 6 & 7];
    }
    if ((uVar4 & 0x20) != 0) {
      uVar4 = m68ki_cpu.dar[uVar4 & 7];
    }
    uVar6 = uVar7 + 7;
    if (-1 < (int)uVar7) {
      uVar6 = uVar7;
    }
    uVar5 = ((int)uVar6 >> 3) + (int)(short)uVar1 + -1 + (uint)((uVar7 & 0x80000007) < 0x80000001);
    uVar1 = uVar4 - 1 & 0x1f;
    uVar6 = -1 << (~(byte)uVar1 & 0x1f);
    sVar3 = (sbyte)(uVar7 & 7);
    my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
    uVar4 = uVar5;
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar4 = pmmu_translate_addr(uVar5);
    }
    uVar2 = m68k_read_memory_32(uVar4 & m68ki_cpu.address_mask);
    m68ki_cpu.n_flag = ((0x80000000U >> sVar3 & uVar2) << sVar3) >> 0x18;
    m68ki_cpu.not_z_flag = uVar6 >> sVar3 & uVar2;
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
    if (0x20 < (uVar7 & 7) + uVar1 + 1) {
      uVar5 = uVar5 + 4;
      my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
      if (m68ki_cpu.pmmu_enabled != 0) {
        uVar5 = pmmu_translate_addr(uVar5);
      }
      uVar1 = m68k_read_memory_8(uVar5 & m68ki_cpu.address_mask);
      m68ki_cpu.not_z_flag = m68ki_cpu.not_z_flag | uVar6 & 0xff & uVar1;
    }
    return;
  }
  m68ki_exception_illegal();
  return;
}

Assistant:

static void m68k_op_bftst_32_aw(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		sint offset = (word2>>6)&31;
		uint width = word2;
		uint mask_base;
		uint data_long;
		uint mask_long;
		uint data_byte = 0;
		uint mask_byte = 0;
		uint ea = EA_AW_8();

		if(BIT_B(word2))
			offset = MAKE_INT_32(REG_D[offset&7]);
		if(BIT_5(word2))
			width = REG_D[width&7];

		/* Offset is signed so we have to use ugly math =( */
		ea += offset / 8;
		offset %= 8;
		if(offset < 0)
		{
			offset += 8;
			ea--;
		}
		width = ((width-1) & 31) + 1;


		mask_base = MASK_OUT_ABOVE_32(0xffffffff << (32 - width));
		mask_long = mask_base >> offset;

		data_long = m68ki_read_32(ea);
		FLAG_N = ((data_long & (0x80000000 >> offset))<<offset)>>24;
		FLAG_Z = data_long & mask_long;
		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;

		if((width + offset) > 32)
		{
			mask_byte = MASK_OUT_ABOVE_8(mask_base);
			data_byte = m68ki_read_8(ea+4);
			FLAG_Z |= (data_byte & mask_byte);
		}
		return;
	}
	m68ki_exception_illegal();
}